

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O0

Bdc_Fun_t * Bdc_ManDecompose_rec(Bdc_Man_t *p,Bdc_Isf_t *pIsf)

{
  int iVar1;
  Bdc_Type_t Type_00;
  Bdc_Fun_t *pBVar2;
  abctime aVar3;
  Bdc_Fun_t *p_00;
  Bdc_Fun_t *pFunc0_00;
  long local_90;
  abctime clk;
  int iVar;
  Bdc_Isf_t *pIsfR;
  Bdc_Isf_t IsfB;
  Bdc_Isf_t *pIsfL;
  Bdc_Isf_t IsfL;
  Bdc_Fun_t *pFunc1;
  Bdc_Fun_t *pFunc0;
  Bdc_Fun_t *pFunc;
  Bdc_Type_t Type;
  Bdc_Isf_t *pIsf_local;
  Bdc_Man_t *p_local;
  
  IsfB.puOff = (uint *)&pIsfL;
  local_90 = 0;
  iVar1 = Kit_TruthIsDisjoint(pIsf->puOn,pIsf->puOff,p->nVars);
  if (iVar1 == 0) {
    __assert_fail("Kit_TruthIsDisjoint(pIsf->puOn, pIsf->puOff, p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/bdc/bdcDec.c"
                  ,0x2b3,"Bdc_Fun_t *Bdc_ManDecompose_rec(Bdc_Man_t *, Bdc_Isf_t *)");
  }
  if (p->pPars->fVerbose != 0) {
    local_90 = Abc_Clock();
  }
  pBVar2 = Bdc_TableLookup(p,pIsf);
  if (p->pPars->fVerbose != 0) {
    aVar3 = Abc_Clock();
    p->timeCache = (aVar3 - local_90) + p->timeCache;
  }
  if (pBVar2 != (Bdc_Fun_t *)0x0) {
    return pBVar2;
  }
  if (p->pPars->fVerbose != 0) {
    local_90 = Abc_Clock();
  }
  Type_00 = Bdc_DecomposeStep(p,pIsf,(Bdc_Isf_t *)IsfB.puOff,(Bdc_Isf_t *)&pIsfR);
  if (p->pPars->fVerbose != 0) {
    aVar3 = Abc_Clock();
    p->timeCheck = (aVar3 - local_90) + p->timeCheck;
  }
  if (Type_00 == BDC_TYPE_MUX) {
    if (p->pPars->fVerbose != 0) {
      local_90 = Abc_Clock();
    }
    iVar1 = Bdc_DecomposeStepMux(p,pIsf,(Bdc_Isf_t *)IsfB.puOff,(Bdc_Isf_t *)&pIsfR);
    if (p->pPars->fVerbose != 0) {
      aVar3 = Abc_Clock();
      p->timeMuxes = (aVar3 - local_90) + p->timeMuxes;
    }
    p->numMuxes = p->numMuxes + 1;
    pBVar2 = Bdc_ManDecompose_rec(p,(Bdc_Isf_t *)IsfB.puOff);
    IsfL.puOff = (uint *)Bdc_ManDecompose_rec(p,(Bdc_Isf_t *)&pIsfR);
    if ((pBVar2 == (Bdc_Fun_t *)0x0) || ((Bdc_Fun_t *)IsfL.puOff == (Bdc_Fun_t *)0x0)) {
      return (Bdc_Fun_t *)0x0;
    }
    p_00 = Bdc_FunWithId(p,iVar1 + 1);
    pFunc0_00 = Bdc_Not(p_00);
    pBVar2 = Bdc_ManCreateGate(p,pFunc0_00,pBVar2,BDC_TYPE_AND);
    IsfL.puOff = (uint *)Bdc_ManCreateGate(p,p_00,(Bdc_Fun_t *)IsfL.puOff,BDC_TYPE_AND);
    if ((pBVar2 == (Bdc_Fun_t *)0x0) || ((Bdc_Fun_t *)IsfL.puOff == (Bdc_Fun_t *)0x0)) {
      return (Bdc_Fun_t *)0x0;
    }
    pFunc0 = Bdc_ManCreateGate(p,pBVar2,(Bdc_Fun_t *)IsfL.puOff,BDC_TYPE_OR);
  }
  else {
    pBVar2 = Bdc_ManDecompose_rec(p,(Bdc_Isf_t *)IsfB.puOff);
    if (pBVar2 == (Bdc_Fun_t *)0x0) {
      return (Bdc_Fun_t *)0x0;
    }
    iVar1 = Bdc_DecomposeUpdateRight
                      (p,pIsf,(Bdc_Isf_t *)IsfB.puOff,(Bdc_Isf_t *)&pIsfR,pBVar2,Type_00);
    if (iVar1 != 0) {
      p->nNodesNew = p->nNodesNew + -1;
      return pBVar2;
    }
    Bdc_SuppMinimize(p,(Bdc_Isf_t *)&pIsfR);
    IsfL.puOff = (uint *)Bdc_ManDecompose_rec(p,(Bdc_Isf_t *)&pIsfR);
    if ((Bdc_Fun_t *)IsfL.puOff == (Bdc_Fun_t *)0x0) {
      return (Bdc_Fun_t *)0x0;
    }
    pFunc0 = Bdc_ManCreateGate(p,pBVar2,(Bdc_Fun_t *)IsfL.puOff,Type_00);
  }
  return pFunc0;
}

Assistant:

Bdc_Fun_t * Bdc_ManDecompose_rec( Bdc_Man_t * p, Bdc_Isf_t * pIsf )
{
//    int static Counter = 0;
//    int LocalCounter = Counter++;
    Bdc_Type_t Type;
    Bdc_Fun_t * pFunc, * pFunc0, * pFunc1;
    Bdc_Isf_t IsfL, * pIsfL = &IsfL;
    Bdc_Isf_t IsfB, * pIsfR = &IsfB;
    int iVar;
    abctime clk = 0; // Suppress "might be used uninitialized"
/*
printf( "Init function (%d):\n", LocalCounter );
Extra_PrintBinary( stdout, pIsf->puOn, 1<<4 );printf("\n");
Extra_PrintBinary( stdout, pIsf->puOff, 1<<4 );printf("\n");
*/
    // check computed results
    assert( Kit_TruthIsDisjoint(pIsf->puOn, pIsf->puOff, p->nVars) );
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    pFunc = Bdc_TableLookup( p, pIsf );
    if ( p->pPars->fVerbose )
        p->timeCache += Abc_Clock() - clk;
    if ( pFunc )
        return pFunc;
    // decide on the decomposition type
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    Type = Bdc_DecomposeStep( p, pIsf, pIsfL, pIsfR );
    if ( p->pPars->fVerbose )
        p->timeCheck += Abc_Clock() - clk;
    if ( Type == BDC_TYPE_MUX )
    {
        if ( p->pPars->fVerbose )
            clk = Abc_Clock();
        iVar = Bdc_DecomposeStepMux( p, pIsf, pIsfL, pIsfR );
        if ( p->pPars->fVerbose )
            p->timeMuxes += Abc_Clock() - clk;
        p->numMuxes++;
        pFunc0 = Bdc_ManDecompose_rec( p, pIsfL );
        pFunc1 = Bdc_ManDecompose_rec( p, pIsfR );
        if ( pFunc0 == NULL || pFunc1 == NULL )
            return NULL;
        pFunc  = Bdc_FunWithId( p, iVar + 1 );
        pFunc0 = Bdc_ManCreateGate( p, Bdc_Not(pFunc), pFunc0, BDC_TYPE_AND );
        pFunc1 = Bdc_ManCreateGate( p, pFunc,  pFunc1, BDC_TYPE_AND );
        if ( pFunc0 == NULL || pFunc1 == NULL )
            return NULL;
        pFunc = Bdc_ManCreateGate( p, pFunc0, pFunc1, BDC_TYPE_OR );
    }
    else
    {
        pFunc0 = Bdc_ManDecompose_rec( p, pIsfL );
        if ( pFunc0 == NULL )
            return NULL;
        // decompose the right branch
        if ( Bdc_DecomposeUpdateRight( p, pIsf, pIsfL, pIsfR, pFunc0, Type ) )
        {
            p->nNodesNew--;
            return pFunc0;
        }
        Bdc_SuppMinimize( p, pIsfR );
        pFunc1 = Bdc_ManDecompose_rec( p, pIsfR );
        if ( pFunc1 == NULL )
            return NULL;
        // create new gate
        pFunc = Bdc_ManCreateGate( p, pFunc0, pFunc1, Type );
    }
    return pFunc;
}